

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall
Clasp::SharedContext::simplify(SharedContext *this,size_type trailStart,bool shuffle)

{
  ConstraintDB *db;
  Literal p;
  uint uVar1;
  Solver *pSVar2;
  Constraint *pCVar3;
  pointer ppSVar4;
  Solver *pSVar5;
  pointer ppCVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Constraint **ppCVar10;
  Share SVar11;
  uint uVar12;
  uint32 uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  
  SVar11 = this->share_;
  if ((SVar11._3_1_ >> 1 & ((uint)SVar11 & 0x3fe) != 0) == 0) {
    uVar9 = (ulong)trailStart;
    pSVar2 = *(this->solvers_).ebo_.buf;
    uVar7 = (pSVar2->assign_).trail.ebo_.size;
    if (trailStart < uVar7) {
      do {
        p.rep_ = (pSVar2->assign_).trail.ebo_.buf[uVar9].rep_;
        if (p.rep_ >> 1 < (this->btig_).graph_.ebo_.size) {
          ShortImplicationsGraph::removeTrue(&this->btig_,*(this->solvers_).ebo_.buf,p);
          uVar7 = (pSVar2->assign_).trail.ebo_.size;
        }
        uVar14 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar14;
      } while (uVar14 != uVar7);
      SVar11 = this->share_;
    }
  }
  pSVar2 = *(this->solvers_).ebo_.buf;
  db = &pSVar2->constraints_;
  if ((((uint)SVar11 & 0x3ff) == 1) || (pSVar2->dbIdx_ == 0)) {
    simplifyDB<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
              (pSVar2,db,shuffle);
  }
  else {
    uVar9 = (ulong)(pSVar2->constraints_).ebo_.size;
    if (uVar9 != 0) {
      uVar17 = 0;
      iVar15 = 0;
      do {
        pCVar3 = (db->ebo_).buf[uVar17];
        iVar8 = (*pCVar3->_vptr_Constraint[4])(pCVar3,*(this->solvers_).ebo_.buf,(ulong)shuffle);
        if ((char)iVar8 != '\0') {
          (*pCVar3->_vptr_Constraint[5])(pCVar3,*(this->solvers_).ebo_.buf,0);
          (db->ebo_).buf[uVar17] = (Constraint *)0x0;
          iVar15 = iVar15 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar9 != uVar17);
      if (iVar15 != 0) {
        uVar7 = (this->solvers_).ebo_.size;
        uVar14 = (pSVar2->constraints_).ebo_.size;
        if (uVar7 != 1) {
          ppSVar4 = (this->solvers_).ebo_.buf;
          uVar12 = 1;
          do {
            pSVar5 = ppSVar4[uVar12];
            uVar1 = pSVar5->dbIdx_;
            if (uVar14 < uVar1) {
              Potassco::fail(-1,"void Clasp::SharedContext::simplify(LitVec::size_type, bool)",0x47a
                             ,"x.dbIdx_ <= db.size()","Invalid DB idx!",0);
            }
            uVar13 = uVar14 - iVar15;
            if (uVar1 == uVar14) {
LAB_001621d4:
              pSVar5->dbIdx_ = uVar13;
            }
            else if ((ulong)uVar1 != 0) {
              lVar16 = 0;
              iVar8 = 0;
              do {
                iVar8 = iVar8 + (uint)(*(long *)((long)(db->ebo_).buf + lVar16) == 0);
                lVar16 = lVar16 + 8;
              } while ((ulong)uVar1 * 8 - lVar16 != 0);
              uVar13 = uVar1 - iVar8;
              goto LAB_001621d4;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar7);
        }
        ppCVar6 = (pSVar2->constraints_).ebo_.buf;
        ppCVar10 = std::__remove_if<Clasp::Constraint**,__gnu_cxx::__ops::_Iter_pred<Clasp::IsNull>>
                             (ppCVar6,ppCVar6 + uVar14);
        uVar7 = (pSVar2->constraints_).ebo_.size;
        (pSVar2->constraints_).ebo_.size =
             uVar7 - (int)((long)(pSVar2->constraints_).ebo_.buf +
                           ((ulong)uVar7 * 8 - (long)ppCVar10) >> 3);
      }
    }
  }
  (*(this->solvers_).ebo_.buf)->dbIdx_ = (pSVar2->constraints_).ebo_.size;
  return;
}

Assistant:

void SharedContext::simplify(LitVec::size_type trailStart, bool shuffle) {
	if (!isShared() && trailStart < master()->trail().size()) {
		for (const LitVec& trail = master()->trail(); trailStart != trail.size(); ++trailStart) {
			Literal p = trail[trailStart];
			if (p.id() < btig_.size()) { btig_.removeTrue(*master(), p); }
		}
	}
	Solver::ConstraintDB& db = master()->constraints_;
	if (concurrency() == 1 || master()->dbIdx_ == 0) {
		Clasp::simplifyDB(*master(), db, shuffle);
	}
	else {
		uint32 rem = 0;
		for (Solver::ConstraintDB::size_type i = 0, end = db.size(); i != end; ++i) {
			Constraint* c = db[i];
			if (c->simplify(*master(), shuffle)) { c->destroy(master(), false); db[i] = 0; ++rem; }
		}
		if (rem) {
			for (SolverVec::size_type s = 1; s != solvers_.size(); ++s) {
				Solver& x = *solvers_[s];
				POTASSCO_ASSERT(x.dbIdx_ <= db.size(), "Invalid DB idx!");
				if      (x.dbIdx_ == db.size()) { x.dbIdx_ -= rem; }
				else if (x.dbIdx_ != 0)         { x.dbIdx_ -= (uint32)std::count_if(db.begin(), db.begin()+x.dbIdx_, IsNull()); }
			}
			db.erase(std::remove_if(db.begin(), db.end(), IsNull()), db.end());
		}
	}
	master()->dbIdx_ = sizeVec(db);
}